

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Downloader.cpp
# Opt level: O1

void __thiscall Downloader::calculateTimeRemaining(Downloader *this,qint64 received,qint64 total)

{
  uint uVar1;
  QLabel *pQVar2;
  double dVar3;
  QArrayData *pQVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  QByteArrayView QVar10;
  QString timeString;
  QString t;
  QArrayData *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  QArrayData *local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  QArrayData *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  QArrayData *local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  QArrayData *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  QDateTime::currentDateTime();
  iVar7 = QDateTime::toSecsSinceEpoch();
  uVar1 = this->m_startTime;
  QDateTime::~QDateTime((QDateTime *)&local_a0);
  uVar9 = iVar7 - uVar1;
  if (uVar9 == 0) {
    return;
  }
  local_88 = (QArrayData *)0x0;
  uStack_80 = 0;
  local_78 = 0;
  lVar8 = (total - received) / (received / (long)(ulong)uVar9);
  dVar3 = (double)lVar8;
  if (lVar8 < 0x1c21) {
    if (lVar8 < 0x3d) {
      if ((int)(dVar3 + 0.5) < 2) {
        QMetaObject::tr((char *)&local_a0,(char *)&staticMetaObject,0x119ef2);
        goto LAB_00115685;
      }
      QMetaObject::tr((char *)&local_70,(char *)&staticMetaObject,0x119ee7);
      QString::arg((longlong)&local_a0,(int)&local_70,(int)(dVar3 + 0.5),(QChar)0x0);
      goto LAB_001155dd;
    }
    iVar7 = (int)(dVar3 / 60.0 + 0.5);
    if (1 < iVar7) {
      QMetaObject::tr((char *)&local_70,(char *)&staticMetaObject,0x119ed3);
      QString::arg((longlong)&local_a0,(int)&local_70,iVar7,(QChar)0x0);
      goto LAB_001155dd;
    }
    QMetaObject::tr((char *)&local_a0,(char *)&staticMetaObject,0x119ede);
LAB_00115685:
    uVar6 = local_78;
    uVar5 = uStack_80;
    local_70 = local_88;
    local_78 = uStack_90;
    uStack_80 = local_98;
    local_88 = local_a0;
    local_a0 = local_70;
    local_98 = uVar5;
    uStack_90 = uVar6;
    if (local_70 == (QArrayData *)0x0) goto LAB_001156cd;
    LOCK();
    (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    iVar7 = (local_70->ref_)._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
  }
  else {
    iVar7 = (int)(dVar3 / 3600.0 + 0.5);
    if (iVar7 < 2) {
      QMetaObject::tr((char *)&local_a0,(char *)&staticMetaObject,0x119ec4);
      goto LAB_00115685;
    }
    QMetaObject::tr((char *)&local_70,(char *)&staticMetaObject,0x119eb5);
    QString::arg((longlong)&local_a0,(int)&local_70,iVar7,(QChar)0x0);
LAB_001155dd:
    uVar6 = local_78;
    uVar5 = uStack_80;
    pQVar4 = local_88;
    local_88 = local_a0;
    local_a0 = pQVar4;
    uStack_80 = local_98;
    local_78 = uStack_90;
    local_98 = uVar5;
    uStack_90 = uVar6;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,8);
      }
    }
    if (local_70 == (QArrayData *)0x0) goto LAB_001156cd;
    LOCK();
    (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    iVar7 = (local_70->ref_)._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
  }
  if (iVar7 == 0) {
    QArrayData::deallocate(local_70,2,8);
  }
LAB_001156cd:
  pQVar2 = (this->m_ui->super_Ui_Downloader).timeLabel;
  QMetaObject::tr((char *)&local_40,(char *)&staticMetaObject,0x119b7e);
  local_58 = local_40;
  local_50 = local_38;
  uStack_48 = uStack_30;
  if (local_40 != (QArrayData *)0x0) {
    LOCK();
    (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QVar10.m_data = (storage_type *)0x2;
  QVar10.m_size = (qsizetype)&local_a0;
  QString::fromUtf8(QVar10);
  QString::append((QString *)&local_58);
  if (local_a0 != (QArrayData *)0x0) {
    LOCK();
    (local_a0->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_a0,2,8);
    }
  }
  local_70 = local_58;
  local_68 = local_50;
  uStack_60 = uStack_48;
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QString::append((QString *)&local_70);
  QLabel::setText((QString *)pQVar2);
  if (local_70 != (QArrayData *)0x0) {
    LOCK();
    (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_70,2,8);
    }
  }
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,8);
    }
  }
  if (local_40 != (QArrayData *)0x0) {
    LOCK();
    (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40,2,8);
    }
  }
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88,2,8);
    }
  }
  return;
}

Assistant:

void Downloader::calculateTimeRemaining(qint64 received, qint64 total)
{
   uint difference = QDateTime::currentDateTime().toSecsSinceEpoch() - m_startTime;

   if (difference > 0)
   {
      QString timeString;
      qreal timeRemaining = (total - received) / (received / difference);

      if (timeRemaining > 7200)
      {
         timeRemaining /= 3600;
         int hours = int(timeRemaining + 0.5);

         if (hours > 1)
            timeString = tr("about %1 hours").arg(hours);
         else
            timeString = tr("about one hour");
      }

      else if (timeRemaining > 60)
      {
         timeRemaining /= 60;
         int minutes = int(timeRemaining + 0.5);

         if (minutes > 1)
            timeString = tr("%1 minutes").arg(minutes);
         else
            timeString = tr("1 minute");
      }

      else if (timeRemaining <= 60)
      {
         int seconds = int(timeRemaining + 0.5);

         if (seconds > 1)
            timeString = tr("%1 seconds").arg(seconds);
         else
            timeString = tr("1 second");
      }

      m_ui->timeLabel->setText(tr("Time remaining") + ": " + timeString);
   }
}